

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O3

void __thiscall singleParticleSpectra::outputRapidityPTDistribution(singleParticleSpectra *this)

{
  double dVar1;
  undefined1 (*pauVar2) [16];
  long lVar3;
  undefined1 auVar4 [16];
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  string rapName;
  ofstream output;
  ostringstream filename;
  char *local_418;
  char *local_410;
  char local_408 [16];
  double local_3f8;
  undefined8 uStack_3f0;
  long local_3e8;
  long local_3e0;
  undefined1 local_3d8 [16];
  char *local_3c8;
  char local_3b8 [16];
  long local_3a8;
  filebuf local_3a0 [16];
  uint auStack_390 [56];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_418 = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"eta","");
  if (this->rap_type == 1) {
    std::__cxx11::string::_M_replace((ulong)&local_418,0,local_410,0x150696);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->path_)._M_dataplus._M_p,
                      (this->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/particle_",10);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->particle_monval);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_pT",3);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_418,(long)local_410);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_distribution",0xd);
  if (this->bWeakFeedDown_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_weakFD",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".dat",4);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_3a8,local_3c8,_S_out);
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a8,"# y  pT  N  E_T",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_3a8,"  Qn_real  Qn_imag (n = 1 -",0x1b);
  poVar5 = (ostream *)std::ostream::operator<<(&local_3a8,this->order_max + -1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a8,"# Nev = ",8);
  poVar5 = (ostream *)std::ostream::operator<<(&local_3a8,this->total_number_of_events);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," d",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_418,(long)local_410);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  poVar5 = std::ostream::_M_insert<double>(this->drap);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," dpT = ",7);
  poVar5 = std::ostream::_M_insert<double>(this->dpT);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," GeV",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  iVar7 = this->N_rap;
  if (0 < iVar7) {
    uVar6 = (ulong)(uint)this->npT;
    lVar8 = 0;
    do {
      if (0 < (int)uVar6) {
        local_3d8._0_8_ =
             (this->rapidity_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
        lVar10 = 0;
        local_3e8 = lVar8;
        do {
          pauVar2 = *(undefined1 (**) [16])
                     (*(long *)&(this->Qn_pTrapdiff_vector).
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar10 * 0x18);
          local_3f8 = *(double *)pauVar2[1];
          uStack_3f0 = 0;
          if (local_3f8 <= 0.0) {
            local_3d8._8_8_ =
                 (this->pT_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
          }
          else {
            auVar4._8_4_ = SUB84(local_3f8,0);
            auVar4._0_8_ = local_3f8;
            auVar4._12_4_ = (int)((ulong)local_3f8 >> 0x20);
            local_3d8 = divpd(*pauVar2,auVar4);
          }
          iVar7 = this->total_number_of_events;
          dVar1 = *(double *)(pauVar2[1] + 8);
          *(uint *)((long)auStack_390 + *(long *)(local_3a8 + -0x18)) =
               *(uint *)((long)auStack_390 + *(long *)(local_3a8 + -0x18)) & 0xfffffefb | 0x100;
          *(undefined8 *)(local_3a0 + *(long *)(local_3a8 + -0x18)) = 8;
          poVar5 = std::ostream::_M_insert<double>(local_3d8._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
          poVar5 = std::ostream::_M_insert<double>((double)local_3d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
          poVar5 = std::ostream::_M_insert<double>(local_3f8 / (double)iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
          std::ostream::_M_insert<double>(dVar1 / (double)iVar7);
          local_3e0 = lVar10;
          if (1 < this->order_max) {
            lVar9 = 1;
            lVar11 = 0x28;
            do {
              lVar3 = *(long *)(*(long *)&(this->Qn_pTrapdiff_vector).
                                          super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data + lVar10 * 0x18);
              local_3f8 = *(double *)(lVar3 + -8 + lVar11);
              dVar1 = *(double *)(lVar3 + lVar11);
              iVar7 = this->total_number_of_events;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3a8,"  ",2);
              poVar5 = std::ostream::_M_insert<double>(local_3f8 / (double)iVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
              std::ostream::_M_insert<double>(dVar1 / (double)iVar7);
              lVar9 = lVar9 + 1;
              lVar11 = lVar11 + 0x10;
            } while (lVar9 < this->order_max);
          }
          std::ios::widen((char)*(undefined8 *)(local_3a8 + -0x18) + (char)&local_3a8);
          lVar10 = local_3e0;
          std::ostream::put((char)&local_3a8);
          std::ostream::flush();
          lVar10 = lVar10 + 1;
          uVar6 = (ulong)this->npT;
        } while (lVar10 < (long)uVar6);
        iVar7 = this->N_rap;
        lVar8 = local_3e8;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
  }
  std::ofstream::close();
  local_3a8 = _VTT;
  *(undefined8 *)(local_3a0 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_3a0);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  return;
}

Assistant:

void singleParticleSpectra::outputRapidityPTDistribution() {
    std::string rapName = "eta";
    if (rap_type == 1) {
        rapName = "y";
    }
    ostringstream filename;
    filename << path_ << "/particle_" << particle_monval << "_pT" << rapName
             << "_distribution";
    if (bWeakFeedDown_) filename << "_weakFD";
    filename << ".dat";
    ofstream output(filename.str().c_str());
    output << "# y  pT  N  E_T"
           << "  Qn_real  Qn_imag (n = 1 -" << order_max - 1 << ")" << endl;
    output << "# Nev = " << total_number_of_events << " d" << rapName << " = "
           << drap << " dpT = " << dpT << " GeV" << endl;

    for (int i = 0; i < N_rap; i++) {
        double rap_bin_mid = rapidity_array[i];
        for (int j = 0; j < npT; j++) {
            double pT_bin_mid = pT_array[j];
            if (Qn_pTrapdiff_vector[i][j][2] > 0) {
                rap_bin_mid =
                    (Qn_pTrapdiff_vector[i][j][0]
                     / Qn_pTrapdiff_vector[i][j][2]);
                pT_bin_mid =
                    (Qn_pTrapdiff_vector[i][j][1]
                     / Qn_pTrapdiff_vector[i][j][2]);
            }
            double dN = Qn_pTrapdiff_vector[i][j][2] / total_number_of_events;
            double dET = Qn_pTrapdiff_vector[i][j][3] / total_number_of_events;
            output << scientific << setprecision(8) << rap_bin_mid << "  "
                   << pT_bin_mid << "  " << dN << "  " << dET;
            // vn
            for (int iorder = 1; iorder < order_max; iorder++) {
                double Qn_real =
                    (Qn_pTrapdiff_vector[i][j][2 * iorder + 2]
                     / total_number_of_events);
                double Qn_imag =
                    (Qn_pTrapdiff_vector[i][j][2 * iorder + 3]
                     / total_number_of_events);
                output << "  " << Qn_real << "  " << Qn_imag;
            }
            output << endl;
        }
    }
    output.close();
}